

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::addPoolNinjaVariable
          (cmNinjaTargetGenerator *this,string *pool_property,cmTarget *target,cmNinjaVars *vars)

{
  char *this_00;
  char *pcVar1;
  mapped_type *this_01;
  allocator local_51;
  key_type local_50;
  char *local_30;
  char *pool;
  cmNinjaVars *vars_local;
  cmTarget *target_local;
  string *pool_property_local;
  cmNinjaTargetGenerator *this_local;
  
  pool = (char *)vars;
  vars_local = (cmNinjaVars *)target;
  target_local = (cmTarget *)pool_property;
  pool_property_local = (string *)this;
  pcVar1 = cmTarget::GetProperty(target,pool_property);
  this_00 = pool;
  if (pcVar1 != (char *)0x0) {
    local_30 = pcVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"pool",&local_51);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)this_00,&local_50);
    std::__cxx11::string::operator=((string *)this_01,pcVar1);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::addPoolNinjaVariable(
                                              const std::string& pool_property,
                                              cmTarget* target,
                                              cmNinjaVars& vars)
{
    const char* pool = target->GetProperty(pool_property);
    if (pool)
      {
      vars["pool"] = pool;
      }
}